

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O2

void __thiscall hwnet::TCPListener::Stop(TCPListener *this)

{
  Poller *this_00;
  bool bVar1;
  Ptr local_50;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  bool local_29 [8];
  bool expected;
  
  if (((this->started)._M_base._M_i & 1U) != 0) {
    local_29[0] = false;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (&this->stop,local_29,true,memory_order_seq_cst);
    if (bVar1) {
      this_00 = this->poller_;
      std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPListener,void>
                ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                 (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPListener>);
      local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
      if (local_40 != (element_type *)0x0) {
        local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_40->events;
      }
      local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Stack_38._M_pi;
      local_40 = (element_type *)0x0;
      _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Poller::Remove(this_00,&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_50.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
      close(this->fd);
    }
  }
  return;
}

Assistant:

void TCPListener::Stop() {
	if(!this->started.load()) {
		return;
	}
	bool expected = false;
	if(!this->stop.compare_exchange_strong(expected,true)) {
		return;
	}
	this->poller_->Remove(shared_from_this());
	::close(this->fd);
}